

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

void Aig_ManPartSetNodePolarity(Aig_Man_t *p,Aig_Man_t *pPart,Vec_Int_t *vPio2Id)

{
  undefined1 *puVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  int iVar6;
  
  puVar1 = &pPart->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  for (iVar6 = 0; iVar6 < pPart->vCis->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pPart->vCis,iVar6);
    iVar2 = Vec_IntEntry(vPio2Id,iVar6);
    pAVar4 = Aig_ManObj(p,iVar2);
    *(ulong *)((long)pvVar3 + 0x18) =
         *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 |
         (ulong)((uint)*(undefined8 *)&pAVar4->field_0x18 & 8);
  }
  for (iVar6 = 0; iVar6 < pPart->vObjs->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pPart->vObjs,iVar6);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar3 + 0x18) =
           (*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7) +
           (ulong)(((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                   *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3) &
                   ((uint)*(ulong *)((long)pvVar3 + 8) ^
                   *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
           * 8;
    }
  }
  iVar6 = 0;
  do {
    if (pPart->vCos->nSize <= iVar6) {
      return;
    }
    pvVar3 = Vec_PtrEntry(pPart->vCos,iVar6);
    iVar2 = Vec_IntEntry(vPio2Id,pPart->nObjs[2] + iVar6);
    pAVar4 = Aig_ManObj(p,iVar2);
    uVar5 = ((int)*(ulong *)((long)pvVar3 + 8) << 3 ^
            *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 8;
    *(ulong *)((long)pvVar3 + 0x18) =
         *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 | (ulong)uVar5;
    iVar6 = iVar6 + 1;
  } while (uVar5 >> 3 == (uint)((*(uint *)&pAVar4->field_0x18 >> 3 & 1) != 0));
  __assert_fail("pObj->fPhase == pObjInit->fPhase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                ,0x14f,"void Aig_ManPartSetNodePolarity(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Aig_ManPartSetNodePolarity( Aig_Man_t * p, Aig_Man_t * pPart, Vec_Int_t * vPio2Id )
{
    Aig_Obj_t * pObj, * pObjInit;
    int i;
    Aig_ManConst1(pPart)->fPhase = 1;
    Aig_ManForEachCi( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, i) );
        pObj->fPhase = pObjInit->fPhase;
    }
    Aig_ManForEachNode( pPart, pObj, i )
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj)) & (Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, Aig_ManCiNum(pPart) + i) );
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj));
        assert( pObj->fPhase == pObjInit->fPhase );
    }
}